

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O3

uint64_t __thiscall
nivalis::Environment::def_func
          (Environment *this,string *func_name,Expr *expr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *arg_bindings)

{
  int iVar1;
  pointer pUVar2;
  unsigned_long uVar3;
  iterator __position;
  void *pvVar4;
  pointer pAVar5;
  bool bVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  pointer puVar9;
  pointer puVar10;
  long *plVar11;
  long lVar12;
  long *plVar13;
  unsigned_long *puVar14;
  pointer puVar15;
  unsigned_long uVar16;
  pointer puVar17;
  mapped_type mVar18;
  ulong uVar19;
  mapped_type fid;
  Expr func_expr;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arg_vars;
  Expr local_b8;
  mapped_type local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_98;
  ASTNode local_90;
  long local_80;
  long lStack_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  local_98 = arg_bindings;
  iVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->freg)._M_t,func_name);
  local_58 = func_name;
  if ((_Rb_tree_header *)iVar7._M_node == &(this->freg)._M_t._M_impl.super__Rb_tree_header) {
    mVar18 = ((long)(this->funcs).
                    super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->funcs).
                    super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](&this->freg,func_name);
    *pmVar8 = mVar18;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::emplace_back<>(&this->funcs);
    std::__cxx11::string::_M_assign
              ((string *)
               ((this->funcs).
                super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1));
  }
  else {
    mVar18 = *(mapped_type *)(iVar7._M_node + 2);
  }
  pUVar2 = (this->funcs).
           super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = *(pointer *)
            &pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl;
  if (*(pointer *)
       ((long)&pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl + 8) != puVar9) {
    *(pointer *)
     ((long)&pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl + 8) = puVar9;
  }
  local_a0 = mVar18;
  std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
            (&local_b8.ast,&expr->ast);
  Expr::optimize(&local_b8,5);
  local_90._0_8_ = (long *)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->vars).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type_conflict2 *)&local_90,
             (allocator_type *)&local_50);
  puVar9 = (local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar12 = (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar9;
  if (lVar12 != 0) {
    lVar12 = lVar12 >> 3;
    uVar16 = 0;
    do {
      uVar3 = puVar9[uVar16];
      if (uVar3 != 0xffffffffffffffff) {
        local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = uVar16;
      }
      uVar16 = uVar16 + 1;
    } while (lVar12 + (ulong)(lVar12 == 0) != uVar16);
  }
  if (local_b8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_b8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar12 = 8;
    uVar19 = 0;
    do {
      iVar1 = *(int *)((long)local_b8.ast.
                             super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8);
      if (iVar1 - 0x11U < 2) {
LAB_0010fb6f:
        uVar16 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [*(long *)((long)&(local_b8.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar12)];
        if (uVar16 == 0xffffffffffffffff) {
          if (iVar1 == 0xc) goto LAB_0010fb96;
        }
        else {
          *(undefined4 *)
           ((long)local_b8.ast.
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8) = 3;
          *(unsigned_long *)
           ((long)&(local_b8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar12) = uVar16;
        }
      }
      else if (iVar1 == 0xc) {
LAB_0010fb96:
        local_90._0_8_ =
             ZEXT48(*(uint *)((long)&(local_b8.ast.
                                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->opcode + lVar12));
        __position._M_current =
             *(pointer *)
              ((long)&pUVar2[mVar18].deps.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
        ;
        if (__position._M_current ==
            *(pointer *)
             ((long)&pUVar2[mVar18].deps.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl +
             0x10)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    (&pUVar2[mVar18].deps,__position,(unsigned_long *)&local_90);
        }
        else {
          *__position._M_current = local_90._0_8_;
          *(unsigned_long **)
           ((long)&pUVar2[mVar18].deps.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
               __position._M_current + 1;
        }
      }
      else if (iVar1 == 2) goto LAB_0010fb6f;
      uVar19 = uVar19 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar19 < (ulong)((long)local_b8.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_b8.ast.
                                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  puVar15 = pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar9 = *(pointer *)
            ((long)&pUVar2[mVar18].deps.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
  puVar17 = puVar15;
  fid = local_a0;
  if (puVar15 != puVar9) {
    uVar19 = (long)puVar9 - (long)puVar15 >> 3;
    lVar12 = 0x3f;
    if (uVar19 != 0) {
      for (; uVar19 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar15,puVar9,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    fid = local_a0;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar15,puVar9);
    puVar15 = pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar17 = *(pointer *)
               ((long)&pUVar2[mVar18].deps.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8
               );
    if (puVar15 != puVar17) {
      puVar14 = puVar15 + 1;
      do {
        puVar9 = puVar14;
        if (puVar9 == puVar17) goto LAB_0010fc80;
        puVar14 = puVar9 + 1;
      } while (puVar9[-1] != *puVar9);
      puVar10 = puVar9 + -1;
      uVar16 = puVar9[-1];
      for (; puVar14 != puVar17; puVar14 = puVar14 + 1) {
        uVar3 = *puVar14;
        if (uVar16 != uVar3) {
          puVar10[1] = uVar3;
          puVar10 = puVar10 + 1;
        }
        uVar16 = uVar3;
      }
      puVar17 = puVar10 + 1;
    }
  }
LAB_0010fc80:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&pUVar2[mVar18].deps,(long)puVar17 - (long)puVar15 >> 3);
  pUVar2[mVar18].n_args =
       (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(local_98->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3;
  pvVar4 = *(void **)&pUVar2[mVar18].expr.ast.
                      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                      ._M_impl;
  pAVar5 = *(pointer *)
            ((long)&pUVar2[mVar18].expr.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
            + 0x10);
  *(pointer *)
   &pUVar2[mVar18].expr.ast.
    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl =
       local_b8.ast.
       super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&pUVar2[mVar18].expr.ast.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> + 8)
       = local_b8.ast.
         super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl
         .super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&pUVar2[mVar18].expr.ast.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> +
   0x10) = local_b8.ast.
           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.ast.super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,(long)pAVar5 - (long)pvVar4);
  }
  bVar6 = anon_unknown_0::check_for_cycle(&this->funcs,fid);
  if (bVar6) {
    Expr::ASTNode::ASTNode(&local_90,null);
    std::vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>>::
    _M_assign_aux<nivalis::Expr::ASTNode_const*>
              ((vector<nivalis::Expr::ASTNode,std::allocator<nivalis::Expr::ASTNode>> *)
               &pUVar2[mVar18].expr,&local_90,&local_80);
    puVar9 = pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pUVar2[mVar18].deps.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) !=
        puVar9) {
      *(pointer *)
       ((long)&pUVar2[mVar18].deps.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl + 8) = puVar9;
    }
    std::operator+(&local_50,"Cycle found in definition of ",local_58);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar13 = plVar11 + 2;
    if ((long *)*plVar11 == plVar13) {
      local_80 = *plVar13;
      lStack_78 = plVar11[3];
      local_90._0_8_ = &local_80;
    }
    else {
      local_80 = *plVar13;
      local_90._0_8_ = (long *)*plVar11;
    }
    local_90.field_1 = *(anon_union_8_3_343d95dd_for_ASTNode_1 *)(plVar11 + 1);
    *plVar11 = (long)plVar13;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->error_msg,(string *)&local_90);
    if ((long *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    fid = 0xffffffffffffffff;
  }
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.ast.
      super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return fid;
}

Assistant:

uint64_t Environment::def_func(const std::string& func_name,
                  const Expr& expr,
                  const std::vector<uint64_t>& arg_bindings) {
    error_msg.clear();
    size_t idx = 0;
    auto it = freg.find(func_name);
    if (it == freg.end()) {
        // New function
        idx = freg[func_name] = funcs.size();
        funcs.emplace_back();
        funcs.back().name = func_name;
    } else {
        idx = it->second;
    }
    UserFunction& func = funcs[idx];
    func.deps.clear();
    Expr func_expr = expr;
    func_expr.optimize(); // Optimize function expression
    auto& ast = func_expr.ast;
    // Invert argument mapping
    std::vector<uint64_t> arg_vars(vars.size(), -1);
    for (size_t i = 0; i < arg_bindings.size(); ++i) {
        if (~arg_bindings[i]) {
            arg_vars[arg_bindings[i]] = i;
        }
    }
    // Sub arguments
    for (size_t i = 0; i < ast.size(); ++i) {
        auto& nd = ast[i];
        if (OpCode::has_ref(nd.opcode) &&
            nd.opcode != OpCode::arg &&
            ~arg_vars[nd.ref]) {
            // Set argument
            nd.opcode = OpCode::arg;
            nd.ref = arg_vars[nd.ref];
        }
        if (nd.opcode == OpCode::call) {
            // Set dependency on other function
            func.deps.push_back(nd.call_info[0]);
        }
    }
    std::sort(func.deps.begin(), func.deps.end());
    func.deps.resize(std::unique(func.deps.begin(), func.deps.end()) - func.deps.begin());
    func.n_args = arg_bindings.size();
    func.expr = std::move(func_expr);

    // Check for recursion
    if (check_for_cycle(funcs, idx)) {
        // Found cycle
        func.expr.ast = { OpCode::null };
        func.deps.clear();
        error_msg = "Cycle found in definition of " + func_name + "(...)\n";
        return -1;
    }
    return idx;
}